

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest11::getTestCaseString_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest11 *this,_test_case *test_case)

{
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"?",&local_11)
  ;
  if (*test_case < TEST_CASE_COUNT) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest11::getTestCaseString(const _test_case& test_case)
{
	std::string result = "?";

	switch (test_case)
	{
	case TEST_CASE_INVALID_TEXTURE_SAMPLING_ATTEMPT:
		result = "TEST_CASE_INVALID_TEXTURE_SAMPLING_ATTEMPT";
		break;
	case TEST_CASE_INVALID_ATOMIC_COUNTER_USAGE_ATTEMPT:
		result = "TEST_CASE_INVALID_ATOMIC_COUNTER_USAGE_ATTEMPT";
		break;
	case TEST_CASE_INVALID_IMAGE_FUNCTION_USAGE_ATTEMPT:
		result = "TEST_CASE_INVALID_IMAGE_FUNCTION_USAGE_ATTEMPT";
		break;
	default:
		break;
	}

	return result;
}